

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

void duckdb::SetSelectionVectorSelect::SetSelectionVector
               (SelectionVector *selection_vector,ValidityMask *validity_mask,
               ValidityMask *input_validity,Vector *selection_entry,idx_t child_idx,
               idx_t *target_offset,idx_t selection_offset,idx_t input_offset,idx_t target_length)

{
  bool bVar1;
  int64_t iVar2;
  idx_t row_idx;
  idx_t row_idx_00;
  Value local_70;
  
  Vector::GetValue(&local_70,selection_entry,child_idx + selection_offset);
  iVar2 = Value::GetValue<long>(&local_70);
  Value::~Value(&local_70);
  row_idx_00 = *target_offset;
  if ((long)target_length < iVar2 || iVar2 < 1) {
    selection_vector->sel_vector[row_idx_00] = 0;
  }
  else {
    row_idx = (input_offset + iVar2) - 1;
    selection_vector->sel_vector[row_idx_00] = (sel_t)row_idx;
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&input_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar1) goto LAB_017ca2de;
    row_idx_00 = *target_offset;
  }
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&validity_mask->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
LAB_017ca2de:
  *target_offset = *target_offset + 1;
  return;
}

Assistant:

static void SetSelectionVector(SelectionVector &selection_vector, ValidityMask &validity_mask,
	                               ValidityMask &input_validity, Vector &selection_entry, idx_t child_idx,
	                               idx_t &target_offset, idx_t selection_offset, idx_t input_offset,
	                               idx_t target_length) {
		auto sel_idx = selection_entry.GetValue(selection_offset + child_idx).GetValue<int64_t>() - 1;
		if (sel_idx >= 0 && sel_idx < UnsafeNumericCast<int64_t>(target_length)) {
			auto sel_idx_unsigned = UnsafeNumericCast<idx_t>(sel_idx);
			selection_vector.set_index(target_offset, input_offset + sel_idx_unsigned);
			if (!input_validity.RowIsValid(input_offset + sel_idx_unsigned)) {
				validity_mask.SetInvalid(target_offset);
			}
		} else {
			selection_vector.set_index(target_offset, 0);
			validity_mask.SetInvalid(target_offset);
		}
		target_offset++;
	}